

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_openmem(void **buffptr,size_t *buffsize,size_t deltasize,
               _func_void_ptr_void_ptr_size_t *memrealloc,int *handle)

{
  int ii;
  int *handle_local;
  _func_void_ptr_void_ptr_size_t *memrealloc_local;
  size_t deltasize_local;
  size_t *buffsize_local;
  void **buffptr_local;
  int local_4;
  
  *handle = -1;
  ii = 0;
  do {
    if (9999 < ii) {
LAB_00126e6b:
      if (*handle == -1) {
        local_4 = 0x67;
      }
      else {
        memTable[ii].memaddrptr = (char **)buffptr;
        memTable[ii].memsizeptr = buffsize;
        memTable[ii].deltasize = deltasize;
        memTable[ii].fitsfilesize = *buffsize;
        memTable[ii].currentpos = 0;
        memTable[ii].mem_realloc = memrealloc;
        local_4 = 0;
      }
      return local_4;
    }
    if (memTable[ii].memaddrptr == (char **)0x0) {
      *handle = ii;
      goto LAB_00126e6b;
    }
    ii = ii + 1;
  } while( true );
}

Assistant:

int mem_openmem(void **buffptr,   /* I - address of memory pointer          */
                size_t *buffsize, /* I - size of buffer, in bytes           */
                size_t deltasize, /* I - increment for future realloc's     */
                void *(*memrealloc)(void *p, size_t newsize),  /* function  */
                int *handle)
/* 
  lowest level routine to open a pre-existing memory file.
*/
{
    int ii;

    *handle = -1;
    for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in handle table */
    {
        if (memTable[ii].memaddrptr == 0)
        {
            *handle = ii;
            break;
        }
    }
    if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

    memTable[ii].memaddrptr = (char **) buffptr; /* pointer to start addres */
    memTable[ii].memsizeptr = buffsize;     /* allocated size of memory */
    memTable[ii].deltasize = deltasize;     /* suggested realloc increment */
    memTable[ii].fitsfilesize = *buffsize;  /* size of FITS file (upper limit) */
    memTable[ii].currentpos = 0;            /* at beginning of the file */
    memTable[ii].mem_realloc = memrealloc;  /* memory realloc function */
    return(0);
}